

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

aiVertexWeight * __thiscall
Assimp::B3DImporter::to_array<aiVertexWeight>
          (B3DImporter *this,vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *v)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  const_reference pvVar5;
  B3DImporter *local_48;
  ulong local_30;
  size_t i;
  aiVertexWeight *p;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *v_local;
  B3DImporter *this_local;
  
  bVar2 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::empty(v);
  if (bVar2) {
    this_local = (B3DImporter *)0x0;
  }
  else {
    sVar3 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size(v);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    this_local = (B3DImporter *)operator_new__(uVar4);
    if (sVar3 != 0) {
      local_48 = this_local;
      do {
        aiVertexWeight::aiVertexWeight((aiVertexWeight *)local_48);
        local_48 = (B3DImporter *)&(local_48->super_BaseImporter).importerUnits;
      } while (local_48 !=
               (B3DImporter *)(&(this_local->super_BaseImporter)._vptr_BaseImporter + sVar3));
    }
    for (local_30 = 0; sVar3 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size(v)
        , local_30 < sVar3; local_30 = local_30 + 1) {
      pvVar5 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::operator[](v,local_30);
      *(value_type *)(&(this_local->super_BaseImporter)._vptr_BaseImporter + local_30) = *pvVar5;
    }
  }
  return (aiVertexWeight *)this_local;
}

Assistant:

T *B3DImporter::to_array( const vector<T> &v ){
    if( v.empty() ) {
        return 0;
    }
    T *p=new T[ v.size() ];
    for( size_t i=0;i<v.size();++i ){
        p[i]=v[i];
    }
    return p;
}